

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectDoms(Gia_Man_t *p)

{
  int *__base;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  size_t __nmemb;
  bool bVar8;
  
  p_00 = Vec_IntAlloc(100);
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManObj(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((pGVar3->field_0x7 & 0x40) != 0) {
      if (p->pRefs != (int *)0x0) {
        iVar1 = Gia_ObjRefNum(p,pGVar3);
        if (iVar1 == 0) goto LAB_004fc6f3;
      }
      iVar1 = Gia_ObjDom(p,pGVar3);
      if (iVar1 != iVar5 && iVar1 != -1) {
        iVar7 = 0x3b9aca01;
        while (iVar7 = iVar7 + -1, iVar7 != 0) {
          pGVar3 = Gia_ManObj(p,iVar1);
          if (((int)(uint)*(undefined8 *)pGVar3 < 0) ||
             (((uint)*(undefined8 *)pGVar3 & 0x1fffffff) == 0x1fffffff)) break;
          Vec_IntPush(p_00,iVar1);
          pGVar3 = Gia_ManObj(p,iVar1);
          iVar2 = Gia_ObjDom(p,pGVar3);
          bVar8 = iVar2 == iVar1;
          iVar1 = iVar2;
          if (bVar8) break;
        }
      }
    }
LAB_004fc6f3:
  }
  __nmemb = (size_t)p_00->nSize;
  if (1 < (long)__nmemb) {
    __base = p_00->pArray;
    qsort(__base,__nmemb,4,Vec_IntSortCompare1);
    iVar5 = 1;
    for (sVar4 = 1; __nmemb != sVar4; sVar4 = sVar4 + 1) {
      if (__base[sVar4] != __base[sVar4 - 1]) {
        lVar6 = (long)iVar5;
        iVar5 = iVar5 + 1;
        __base[lVar6] = __base[sVar4];
      }
    }
    p_00->nSize = iVar5;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int Lev, LevMax = ABC_INFINITY;
    int i, iDom, iDomNext;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMark1 )
            continue;
        if ( p->pRefs && Gia_ObjRefNum(p, pObj) == 0 )
            continue;
        iDom = Gia_ObjDom(p, pObj);
        if ( iDom == -1 )
            continue;
        if ( iDom == i )
            continue;
        for ( Lev = 0; Lev < LevMax && Gia_ObjIsAnd( Gia_ManObj(p, iDom) ); Lev++ )
        {
            Vec_IntPush( vNodes, iDom );
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom) );
            if ( iDomNext == iDom )
                break;
            iDom = iDomNext;
        }
    }
    Vec_IntUniqify( vNodes );
    return vNodes;
}